

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp_uint_t sexp_bignum_fxdiv(sexp ctx,sexp a,sexp_uint_t b,int offset)

{
  long lVar1;
  sexp_uint_t sVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  sexp in_RSI;
  sexp_luint_t n;
  int i;
  sexp_uint_t r;
  sexp_uint_t q;
  sexp_uint_t *data;
  sexp_uint_t len;
  int local_44;
  sexp_uint_t local_40;
  
  sVar2 = sexp_bignum_hi(in_RSI);
  local_40 = 0;
  local_44 = (int)sVar2;
  while (local_44 = local_44 + -1, in_ECX <= local_44) {
    lVar1 = *(long *)((long)&in_RSI->value + (long)local_44 * 8 + 0x10);
    lVar3 = __udivti3(lVar1,local_40,in_RDX,0);
    local_40 = lVar1 - lVar3 * in_RDX;
    *(long *)((long)&in_RSI->value + (long)local_44 * 8 + 0x10) = lVar3;
  }
  return local_40;
}

Assistant:

sexp_uint_t sexp_bignum_fxdiv (sexp ctx, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, r=0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  for (i=len-1; i>=offset; i--) {
    n = luint_add(luint_shl(n,  sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b));
    r = luint_to_uint(luint_sub(n, luint_mul_uint(luint_from_uint(q),  b)));
    data[i] = q;
    n = luint_from_uint(r);
  }
  return r;
}